

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

void __thiscall CMU462::StaticScene::BVHAccel::~BVHAccel(BVHAccel *this)

{
  BVHNode *in_RDI;
  BVHAccel *unaff_retaddr;
  
  (in_RDI->bb).max.x = (double)&PTR_get_bbox_003bae10;
  delete_tree(unaff_retaddr,in_RDI);
  printf("BVH deleted!\n");
  Aggregate::~Aggregate((Aggregate *)0x24fc02);
  return;
}

Assistant:

BVHAccel::~BVHAccel() {
		// TODO (PathTracer):
		// Implement a proper destructor for your BVH accelerator aggregate
		delete_tree(root);
		printf("BVH deleted!\n");
	}